

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O0

void __thiscall icu_63::DateFormat::DateFormat(DateFormat *this,DateFormat *other)

{
  DateFormat *other_local;
  DateFormat *this_local;
  
  Format::Format(&this->super_Format,&other->super_Format);
  (this->super_Format).super_UObject._vptr_UObject = (_func_int **)&PTR__DateFormat_005bcca0;
  this->fCalendar = (Calendar *)0x0;
  this->fNumberFormat = (NumberFormat *)0x0;
  EnumSet<UDateFormatBooleanAttribute,_0U,_4U>::EnumSet(&this->fBoolFlags);
  this->fCapitalizationContext = UDISPCTX_CAPITALIZATION_NONE;
  operator=(this,other);
  return;
}

Assistant:

DateFormat::DateFormat(const DateFormat& other)
:   Format(other),
    fCalendar(0),
    fNumberFormat(0),
    fCapitalizationContext(UDISPCTX_CAPITALIZATION_NONE)
{
    *this = other;
}